

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O0

void R_RenderBSPNode(void *node)

{
  bool bVar1;
  TVector2<double> local_30;
  uint local_1c;
  node_t *pnStack_18;
  int side;
  node_t *bsp;
  void *node_local;
  
  bsp = (node_t *)node;
  if (numnodes == 0) {
    R_Subsector(subsectors);
  }
  else {
    while (((ulong)bsp & 1) == 0) {
      pnStack_18 = bsp;
      TVector2<double>::TVector2(&local_30,&ViewPos);
      local_1c = R_PointOnSide(&local_30,pnStack_18);
      R_RenderBSPNode(*(void **)((long)&pnStack_18->field_6 + (long)(int)local_1c * 8));
      local_1c = local_1c ^ 1;
      bVar1 = R_CheckBBox((float *)((long)&pnStack_18->field_4 + (long)(int)local_1c * 0x10));
      if (!bVar1) {
        return;
      }
      bsp = *(node_t **)((long)&pnStack_18->field_6 + (long)(int)local_1c * 8);
    }
    R_Subsector((subsector_t *)((long)&bsp[-1].field_6 + 0xf));
  }
  return;
}

Assistant:

void R_RenderBSPNode (void *node)
{
	if (numnodes == 0)
	{
		R_Subsector (subsectors);
		return;
	}
	while (!((size_t)node & 1))  // Keep going until found a subsector
	{
		node_t *bsp = (node_t *)node;

		// Decide which side the view point is on.
		int side = R_PointOnSide (ViewPos, bsp);

		// Recursively divide front space (toward the viewer).
		R_RenderBSPNode (bsp->children[side]);

		// Possibly divide back space (away from the viewer).
		side ^= 1;
		if (!R_CheckBBox (bsp->bbox[side]))
			return;

		node = bsp->children[side];
	}
	R_Subsector ((subsector_t *)((BYTE *)node - 1));
}